

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

void des3_cbc1_cbc_decrypt(ssh_cipher *ciph,void *vdata,int len)

{
  LR lr_00;
  LR LVar1;
  LR plaintext;
  LR cipher_out;
  LR lr;
  LR ciphertext;
  uint8_t *data;
  des3_cbc1_ctx *ctx;
  int len_local;
  void *vdata_local;
  ssh_cipher *ciph_local;
  
  ciphertext = (LR)vdata;
  for (ctx._4_4_ = len; 0 < ctx._4_4_; ctx._4_4_ = ctx._4_4_ + -8) {
    lr_00 = des_load_lr((void *)ciphertext);
    LVar1 = des_IP(lr_00);
    LVar1 = des_inner_cipher(LVar1,(des_keysched *)(ciph + -0x11),0xf,0xffffffffffffffff);
    LVar1 = des_inner_cipher(LVar1,(des_keysched *)(ciph + -0x21),0,1);
    LVar1 = des_inner_cipher(LVar1,(des_keysched *)(ciph + -0x31),0xf,0xffffffffffffffff);
    LVar1 = des_FP(LVar1);
    LVar1 = des_xor_lr(LVar1,*(LR *)(ciph + -1));
    des_store_lr((void *)ciphertext,LVar1);
    *(LR *)(ciph + -1) = lr_00;
    ciphertext = (LR)((long)ciphertext + 8);
  }
  return;
}

Assistant:

static void des3_cbc1_cbc_decrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des3_cbc1_ctx *ctx = container_of(ciph, struct des3_cbc1_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    for (; len > 0; len -= 8, data += 8) {
        LR ciphertext = des_load_lr(data);

        /* Similarly to encryption, but with the order reversed. */
        LR lr = des_IP(ciphertext);
        lr = des_inner_cipher(lr, &ctx->sched[2], DECIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[1], ENCIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[0], DECIPHER);
        LR cipher_out = des_FP(lr);

        LR plaintext = des_xor_lr(cipher_out, ctx->iv);
        des_store_lr(data, plaintext);
        ctx->iv = ciphertext;
    }
}